

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O2

SubstIterator __thiscall
Kernel::RobSubstitution::getAssocIterator<Kernel::RobSubstitution::MatchingFn>
          (RobSubstitution *this,RobSubstitution *subst,Literal *l1,int l1Index,Literal *l2,
          int l2Index,bool complementary)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined4 in_register_0000000c;
  Literal *l1_00;
  undefined4 in_register_0000008c;
  undefined3 in_stack_00000009;
  bool in_stack_00000010;
  ContextualIterator<Lib::SingletonIterator<Kernel::RobSubstitution_*>,_Kernel::RobSubstitution::AssocContext<Kernel::RobSubstitution::MatchingFn>_>
  local_80;
  
  l1_00 = (Literal *)CONCAT44(in_register_0000000c,l1Index);
  bVar1 = Literal::headersMatch
                    (l1_00,(Literal *)CONCAT44(in_register_0000008c,l2Index),in_stack_00000010);
  if (bVar1) {
    if ((l1_00->super_Term)._functor == 0) {
      puVar2 = (undefined8 *)::operator_new(0x50);
      *puVar2 = &PTR__AssocIterator_009ff438;
      puVar2[2] = l1;
      puVar2[3] = l1_00;
      *(int *)(puVar2 + 4) = (int)l2;
      puVar2[5] = (Literal *)CONCAT44(in_register_0000008c,l2Index);
      *(int *)(puVar2 + 6) = _complementary;
      *(undefined4 *)(puVar2 + 9) = 0;
      puVar2[7] = 0;
      puVar2[8] = 0;
      *(undefined1 *)((long)puVar2 + 0x4c) = 1;
      (this->super_Backtrackable)._bdStack._capacity = (size_t)puVar2;
      *(undefined4 *)(puVar2 + 1) = 1;
    }
    else {
      local_80._context._l2i = _complementary;
      local_80._context._bdata._boList = (BacktrackObject *)0x0;
      local_80._inContext = false;
      local_80._used = true;
      local_80._iit._finished = false;
      local_80._current.super_OptionBase<Kernel::RobSubstitution_*>._isSome = false;
      local_80._context._l1 = l1_00;
      local_80._context._l1i = (int)l2;
      local_80._context._l2 = (Literal *)CONCAT44(in_register_0000008c,l2Index);
      local_80._iit._el = (RobSubstitution *)l1;
      Lib::
      pvi<Lib::ContextualIterator<Lib::SingletonIterator<Kernel::RobSubstitution*>,Kernel::RobSubstitution::AssocContext<Kernel::RobSubstitution::MatchingFn>>>
                ((Lib *)this,&local_80);
      Lib::
      ContextualIterator<Lib::SingletonIterator<Kernel::RobSubstitution_*>,_Kernel::RobSubstitution::AssocContext<Kernel::RobSubstitution::MatchingFn>_>
      ::~ContextualIterator(&local_80);
    }
  }
  else {
    Lib::VirtualIterator<Kernel::RobSubstitution_*>::getEmpty();
  }
  return (SubstIterator)(IteratorCore<Kernel::RobSubstitution_*> *)this;
}

Assistant:

SubstIterator RobSubstitution::getAssocIterator(RobSubstitution* subst,
	  Literal* l1, int l1Index, Literal* l2, int l2Index, bool complementary)
{
  if( !Literal::headersMatch(l1,l2,complementary) ) {
    return SubstIterator::getEmpty();
  }

  if( !l1->isEquality() ) {
    return pvi( getContextualIterator(getSingletonIterator(subst),
	    AssocContext<Fn>(l1, l1Index, l2, l2Index)) );
  } else {
    return vi(
	    new AssocIterator<Fn>(subst, l1, l1Index, l2, l2Index));
  }
}